

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

bool __thiscall
perfetto::protos::gen::CommitDataRequest_ChunkToPatch::ParseFromArray
          (CommitDataRequest_ChunkToPatch *this,void *raw,size_t size)

{
  byte bVar1;
  pointer pCVar2;
  pointer pCVar3;
  bool bVar4;
  short sVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong *puVar10;
  ulong *puVar11;
  uint8_t cur_byte_2;
  uint32_t uVar12;
  uint8_t cur_byte;
  ulong uVar13;
  uint8_t cur_byte_1;
  pointer pCVar14;
  ulong *puVar15;
  Field local_58;
  CommitDataRequest_ChunkToPatch *local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  vector<perfetto::protos::gen::CommitDataRequest_ChunkToPatch_Patch,_std::allocator<perfetto::protos::gen::CommitDataRequest_ChunkToPatch_Patch>_>
  *local_38;
  
  pCVar2 = (this->patches_).
           super__Vector_base<perfetto::protos::gen::CommitDataRequest_ChunkToPatch_Patch,_std::allocator<perfetto::protos::gen::CommitDataRequest_ChunkToPatch_Patch>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pCVar3 = (this->patches_).
           super__Vector_base<perfetto::protos::gen::CommitDataRequest_ChunkToPatch_Patch,_std::allocator<perfetto::protos::gen::CommitDataRequest_ChunkToPatch_Patch>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pCVar14 = pCVar2;
  if (pCVar3 != pCVar2) {
    do {
      (**(pCVar14->super_CppMessageObj)._vptr_CppMessageObj)(pCVar14);
      pCVar14 = pCVar14 + 1;
    } while (pCVar14 != pCVar3);
    (this->patches_).
    super__Vector_base<perfetto::protos::gen::CommitDataRequest_ChunkToPatch_Patch,_std::allocator<perfetto::protos::gen::CommitDataRequest_ChunkToPatch_Patch>_>
    ._M_impl.super__Vector_impl_data._M_finish = pCVar2;
  }
  (this->unknown_fields_)._M_string_length = 0;
  local_38 = &this->patches_;
  local_40 = &this->unknown_fields_;
  *(this->unknown_fields_)._M_dataplus._M_p = '\0';
  puVar10 = (ulong *)(size + (long)raw);
  do {
    if (puVar10 <= raw) goto switchD_00224131_caseD_3;
    bVar1 = (byte)*raw;
    uVar9 = (ulong)bVar1;
    puVar11 = (ulong *)((long)raw + 1);
    if ((char)bVar1 < '\0') {
      uVar9 = (ulong)(bVar1 & 0x7f);
      lVar7 = 7;
      do {
        if ((puVar10 <= puVar11) || (0x38 < lVar7 - 7U)) goto switchD_00224131_caseD_3;
        uVar6 = *puVar11;
        puVar11 = (ulong *)((long)puVar11 + 1);
        uVar9 = uVar9 | (ulong)((byte)uVar6 & 0x7f) << ((byte)lVar7 & 0x3f);
        lVar7 = lVar7 + 7;
      } while ((char)(byte)uVar6 < '\0');
    }
    uVar6 = uVar9 >> 3;
    if (((uint)uVar6 == 0) || (puVar10 <= puVar11)) goto switchD_00224131_caseD_3;
    switch((uint)uVar9 & 7) {
    case 0:
      uVar8 = 0;
      uVar13 = 0;
      while( true ) {
        puVar15 = (ulong *)((long)puVar11 + 1);
        uVar8 = (ulong)((byte)*puVar11 & 0x7f) << ((byte)uVar13 & 0x3f) | uVar8;
        if (-1 < (char)(byte)*puVar11) break;
        if ((puVar10 <= puVar15) ||
           (bVar4 = 0x38 < uVar13, uVar13 = uVar13 + 7, puVar11 = puVar15, bVar4))
        goto switchD_00224131_caseD_3;
      }
      local_58.int_value_ = uVar8 & 0xffffffff00000000;
      break;
    case 1:
      puVar15 = puVar11 + 1;
      if (puVar10 < puVar15) goto switchD_00224131_caseD_3;
      uVar8 = *puVar11;
      local_58.int_value_ = uVar8 & 0xffffffff00000000;
      break;
    case 2:
      puVar11 = (ulong *)((long)puVar11 + 1);
      uVar13 = 0;
      uVar8 = 0;
      puVar15 = puVar11;
      while (uVar13 = (ulong)(*(byte *)((long)puVar15 + -1) & 0x7f) << ((byte)uVar8 & 0x3f) | uVar13
            , (char)*(byte *)((long)puVar15 + -1) < '\0') {
        if (puVar10 <= puVar15) goto switchD_00224131_caseD_3;
        puVar15 = (ulong *)((long)puVar15 + 1);
        puVar11 = (ulong *)((long)puVar11 + 1);
        bVar4 = 0x38 < uVar8;
        uVar8 = uVar8 + 7;
        if (bVar4) goto switchD_00224131_caseD_3;
      }
      if (uVar13 <= (ulong)((long)puVar10 - (long)puVar11)) {
        local_58.int_value_ = (ulong)puVar11 & 0xffffffff00000000;
        puVar15 = (ulong *)((long)puVar15 + uVar13);
        uVar8 = (ulong)puVar11 & 0xffffffff;
        goto LAB_0022420e;
      }
    default:
      goto switchD_00224131_caseD_3;
    case 5:
      puVar15 = (ulong *)((long)puVar11 + 4);
      if (puVar10 < puVar15) goto switchD_00224131_caseD_3;
      uVar8 = (ulong)(uint)*puVar11;
      local_58.int_value_ = 0;
    }
    uVar13 = 0;
LAB_0022420e:
    raw = puVar15;
  } while ((0xffff < (uint)uVar6) || (0xfffffff < uVar13));
  local_58.int_value_ = local_58.int_value_ | uVar8 & 0xffffffff;
  uVar8 = uVar6 << 0x20 | uVar13;
  local_58.type_ = (byte)(uVar8 >> 0x30) | (byte)uVar9 & 7;
  local_58.size_ = (uint32_t)uVar13;
  local_58.id_ = (uint16_t)(uVar8 >> 0x20);
  sVar5 = (short)uVar6;
  while (sVar5 != 0) {
    if ((ushort)uVar6 < 6) {
      (this->_has_field_).super__Base_bitset<1UL>._M_w =
           (this->_has_field_).super__Base_bitset<1UL>._M_w | 1L << ((byte)uVar6 & 0x3f);
    }
    uVar12 = (uint32_t)local_58.int_value_;
    switch((uint)uVar6 & 0xffff) {
    case 1:
      this->target_buffer_ = uVar12;
      break;
    case 2:
      this->writer_id_ = uVar12;
      break;
    case 3:
      this->chunk_id_ = uVar12;
      break;
    case 4:
      std::
      vector<perfetto::protos::gen::CommitDataRequest_ChunkToPatch_Patch,_std::allocator<perfetto::protos::gen::CommitDataRequest_ChunkToPatch_Patch>_>
      ::emplace_back<>(local_38);
      pCVar2 = (this->patches_).
               super__Vector_base<perfetto::protos::gen::CommitDataRequest_ChunkToPatch_Patch,_std::allocator<perfetto::protos::gen::CommitDataRequest_ChunkToPatch_Patch>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      (*pCVar2[-1].super_CppMessageObj._vptr_CppMessageObj[4])
                (pCVar2 + -1,local_58.int_value_,(ulong)local_58.size_);
      break;
    case 5:
      this->has_more_patches_ = local_58.int_value_ != 0;
      break;
    default:
      local_48 = this;
      protozero::Field::SerializeAndAppendToInternal<std::__cxx11::string>(&local_58,local_40);
      this = local_48;
    }
    do {
      if (puVar10 <= raw) goto switchD_00224131_caseD_3;
      bVar1 = (byte)*raw;
      uVar9 = (ulong)(uint)bVar1;
      puVar11 = (ulong *)((long)raw + 1);
      if ((char)bVar1 < '\0') {
        uVar9 = (ulong)(bVar1 & 0x7f);
        lVar7 = 7;
        do {
          if ((puVar10 <= puVar11) || (0x38 < lVar7 - 7U)) goto switchD_00224131_caseD_3;
          uVar6 = *puVar11;
          puVar11 = (ulong *)((long)puVar11 + 1);
          uVar9 = uVar9 | (ulong)((byte)uVar6 & 0x7f) << ((byte)lVar7 & 0x3f);
          lVar7 = lVar7 + 7;
        } while ((char)(byte)uVar6 < '\0');
      }
      uVar6 = uVar9 >> 3;
      if (((uint)uVar6 == 0) || (puVar10 <= puVar11)) goto switchD_00224131_caseD_3;
      switch((uint)uVar9 & 7) {
      case 0:
        uVar8 = 0;
        uVar13 = 0;
        while( true ) {
          puVar15 = (ulong *)((long)puVar11 + 1);
          uVar8 = (ulong)((byte)*puVar11 & 0x7f) << ((byte)uVar13 & 0x3f) | uVar8;
          if (-1 < (char)(byte)*puVar11) break;
          if ((puVar10 <= puVar15) ||
             (bVar4 = 0x38 < uVar13, uVar13 = uVar13 + 7, puVar11 = puVar15, bVar4))
          goto switchD_00224131_caseD_3;
        }
        local_58.int_value_ = uVar8 & 0xffffffff00000000;
        break;
      case 1:
        puVar15 = puVar11 + 1;
        if (puVar10 < puVar15) goto switchD_00224131_caseD_3;
        uVar8 = *puVar11;
        local_58.int_value_ = uVar8 & 0xffffffff00000000;
        break;
      case 2:
        puVar11 = (ulong *)((long)puVar11 + 1);
        uVar13 = 0;
        uVar8 = 0;
        puVar15 = puVar11;
        while (uVar13 = (ulong)(*(byte *)((long)puVar15 + -1) & 0x7f) << ((byte)uVar8 & 0x3f) |
                        uVar13, (char)*(byte *)((long)puVar15 + -1) < '\0') {
          if (puVar10 <= puVar15) goto switchD_00224131_caseD_3;
          puVar15 = (ulong *)((long)puVar15 + 1);
          puVar11 = (ulong *)((long)puVar11 + 1);
          bVar4 = 0x38 < uVar8;
          uVar8 = uVar8 + 7;
          if (bVar4) goto switchD_00224131_caseD_3;
        }
        if (uVar13 <= (ulong)((long)puVar10 - (long)puVar11)) {
          local_58.int_value_ = (ulong)puVar11 & 0xffffffff00000000;
          puVar15 = (ulong *)((long)puVar15 + uVar13);
          uVar8 = (ulong)puVar11 & 0xffffffff;
          goto LAB_0022452f;
        }
      default:
        goto switchD_00224131_caseD_3;
      case 5:
        puVar15 = (ulong *)((long)puVar11 + 4);
        if (puVar10 < puVar15) goto switchD_00224131_caseD_3;
        uVar8 = (ulong)(uint)*puVar11;
        local_58.int_value_ = 0;
      }
      uVar13 = 0;
LAB_0022452f:
      raw = puVar15;
    } while ((0xffff < (uint)uVar6) || (0xfffffff < uVar13));
    local_58.int_value_ = local_58.int_value_ | uVar8 & 0xffffffff;
    uVar8 = uVar6 << 0x20 | uVar13;
    local_58.type_ = (byte)(uVar8 >> 0x30) | (byte)uVar9 & 7;
    local_58.size_ = (uint32_t)uVar13;
    local_58.id_ = (uint16_t)(uVar8 >> 0x20);
    sVar5 = (short)uVar6;
  }
switchD_00224131_caseD_3:
  return puVar10 == (ulong *)raw;
}

Assistant:

bool CommitDataRequest_ChunkToPatch::ParseFromArray(const void* raw, size_t size) {
  patches_.clear();
  unknown_fields_.clear();
  bool packed_error = false;

  ::protozero::ProtoDecoder dec(raw, size);
  for (auto field = dec.ReadField(); field.valid(); field = dec.ReadField()) {
    if (field.id() < _has_field_.size()) {
      _has_field_.set(field.id());
    }
    switch (field.id()) {
      case 1 /* target_buffer */:
        field.get(&target_buffer_);
        break;
      case 2 /* writer_id */:
        field.get(&writer_id_);
        break;
      case 3 /* chunk_id */:
        field.get(&chunk_id_);
        break;
      case 4 /* patches */:
        patches_.emplace_back();
        patches_.back().ParseFromArray(field.data(), field.size());
        break;
      case 5 /* has_more_patches */:
        field.get(&has_more_patches_);
        break;
      default:
        field.SerializeAndAppendTo(&unknown_fields_);
        break;
    }
  }
  return !packed_error && !dec.bytes_left();
}